

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::SequenceMethod::checkArguments
          (SequenceMethod *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4
          )

{
  Compilation *pCVar1;
  bool bVar2;
  long lVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,0)
  ;
  lVar3 = 400;
  if (bVar2) {
    checkLocalVars(this,*args->_M_ptr,context,range);
    lVar3 = 0x148;
    if ((((context->flags).m_bits & 0x10000) == 0) && (this->isMatched == true)) {
      ASTContext::addDiag(context,(DiagCode)0x25000b,range);
      lVar3 = 400;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar3);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        checkLocalVars(*args[0], context, range);

        if (!context.flags.has(ASTFlags::AssertionExpr) && isMatched) {
            context.addDiag(diag::SequenceMatchedOutsideAssertion, range);
            return comp.getErrorType();
        }

        return comp.getBitType();
    }